

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locutil.cpp
# Opt level: O0

Hashtable * icu_63::LocaleUtility::getAvailableLocaleNames(UnicodeString *bundleID)

{
  bool bVar1;
  Hashtable *this;
  UBool UVar2;
  Hashtable *pHVar3;
  UnicodeString *pUVar4;
  void *p;
  UEnumeration *local_120;
  Hashtable *local_100;
  Hashtable *t;
  UnicodeString local_e8;
  UChar *local_a8;
  UChar *id;
  UEnumeration *uenum;
  char *path;
  CharString cbundleID;
  Hashtable *local_30;
  Hashtable *htp;
  Hashtable *cache;
  UnicodeString *pUStack_18;
  UErrorCode status;
  UnicodeString *bundleID_local;
  
  cache._4_4_ = U_ZERO_ERROR;
  pUStack_18 = bundleID;
  umtx_initOnce(&LocaleUtilityInitOnce,locale_utility_init,(UErrorCode *)((long)&cache + 4));
  this = LocaleUtility_cache;
  if (LocaleUtility_cache == (Hashtable *)0x0) {
    bundleID_local = (UnicodeString *)0x0;
  }
  else {
    umtx_lock_63((UMutex *)0x0);
    pUVar4 = pUStack_18;
    local_30 = (Hashtable *)Hashtable::get(this,pUStack_18);
    umtx_unlock_63((UMutex *)0x0);
    if (local_30 == (Hashtable *)0x0) {
      pHVar3 = (Hashtable *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar4);
      local_100 = (Hashtable *)0x0;
      if (pHVar3 != (Hashtable *)0x0) {
        Hashtable::Hashtable(pHVar3,(UErrorCode *)((long)&cache + 4));
        local_100 = pHVar3;
      }
      local_30 = local_100;
      if ((local_100 != (Hashtable *)0x0) && (UVar2 = ::U_SUCCESS(cache._4_4_), UVar2 != '\0')) {
        CharString::CharString((CharString *)&path);
        CharString::appendInvariantChars
                  ((CharString *)&path,pUStack_18,(UErrorCode *)((long)&cache + 4));
        UVar2 = CharString::isEmpty((CharString *)&path);
        if (UVar2 == '\0') {
          local_120 = (UEnumeration *)CharString::data((CharString *)&path);
        }
        else {
          local_120 = (UEnumeration *)0x0;
        }
        uenum = local_120;
        id = (UChar *)ures_openAvailableLocales_63
                                ((char *)local_120,(UErrorCode *)((long)&cache + 4));
        while( true ) {
          p = (void *)0x0;
          local_a8 = uenum_unext_63((UEnumeration *)id,(int32_t *)0x0,
                                    (UErrorCode *)((long)&cache + 4));
          if (local_a8 == (UChar *)0x0) break;
          UnicodeString::UnicodeString(&local_e8,local_a8);
          Hashtable::put(local_100,&local_e8,local_100,(UErrorCode *)((long)&cache + 4));
          UnicodeString::~UnicodeString(&local_e8);
        }
        uenum_close_63((UEnumeration *)id);
        UVar2 = ::U_FAILURE(cache._4_4_);
        if (UVar2 == '\0') {
          umtx_lock_63((UMutex *)0x0);
          pUVar4 = pUStack_18;
          pHVar3 = (Hashtable *)Hashtable::get(this,pUStack_18);
          if (pHVar3 == (Hashtable *)0x0) {
            Hashtable::put(this,pUStack_18,local_100,(UErrorCode *)((long)&cache + 4));
            umtx_unlock_63((UMutex *)0x0);
          }
          else {
            umtx_unlock_63((UMutex *)0x0);
            local_30 = pHVar3;
            if (local_100 != (Hashtable *)0x0) {
              Hashtable::~Hashtable(local_100);
              UMemory::operator_delete((UMemory *)local_100,pUVar4);
            }
          }
          bVar1 = false;
        }
        else {
          if (local_100 != (Hashtable *)0x0) {
            Hashtable::~Hashtable(local_100);
            UMemory::operator_delete((UMemory *)local_100,p);
          }
          bundleID_local = (UnicodeString *)0x0;
          bVar1 = true;
        }
        CharString::~CharString((CharString *)&path);
        if (bVar1) {
          return (Hashtable *)bundleID_local;
        }
      }
    }
    bundleID_local = (UnicodeString *)local_30;
  }
  return (Hashtable *)bundleID_local;
}

Assistant:

const Hashtable*
LocaleUtility::getAvailableLocaleNames(const UnicodeString& bundleID)
{
    // LocaleUtility_cache is a hash-of-hashes.  The top-level keys
    // are path strings ('bundleID') passed to
    // ures_openAvailableLocales.  The top-level values are
    // second-level hashes.  The second-level keys are result strings
    // from ures_openAvailableLocales.  The second-level values are
    // garbage ((void*)1 or other random pointer).

    UErrorCode status = U_ZERO_ERROR;
    umtx_initOnce(LocaleUtilityInitOnce, locale_utility_init, status);
    Hashtable *cache = LocaleUtility_cache;
    if (cache == NULL) {
        // Catastrophic failure.
        return NULL;
    }

    Hashtable* htp;
    umtx_lock(NULL);
    htp = (Hashtable*) cache->get(bundleID);
    umtx_unlock(NULL);

    if (htp == NULL) {
        htp = new Hashtable(status);
        if (htp && U_SUCCESS(status)) {
            CharString cbundleID;
            cbundleID.appendInvariantChars(bundleID, status);
            const char* path = cbundleID.isEmpty() ? NULL : cbundleID.data();
            UEnumeration *uenum = ures_openAvailableLocales(path, &status);
            for (;;) {
                const UChar* id = uenum_unext(uenum, NULL, &status);
                if (id == NULL) {
                    break;
                }
                htp->put(UnicodeString(id), (void*)htp, status);
            }
            uenum_close(uenum);
            if (U_FAILURE(status)) {
                delete htp;
                return NULL;
            }
            umtx_lock(NULL);
            Hashtable *t = static_cast<Hashtable *>(cache->get(bundleID));
            if (t != NULL) {
                // Another thread raced through this code, creating the cache entry first.
                // Discard ours and return theirs.
                umtx_unlock(NULL);
                delete htp;
                htp = t;
            } else {
                cache->put(bundleID, (void*)htp, status);
                umtx_unlock(NULL);
            }
        }
    }
    return htp;
}